

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

qpdf_object_type_e __thiscall qpdf::BaseHandle::type_code(BaseHandle *this)

{
  QPDF *qpdf;
  bool bVar1;
  qpdf_object_type_e qVar2;
  element_type *peVar3;
  __shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  BaseHandle *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    qVar2 = raw_type_code(this);
    if (qVar2 == ot_unresolved) {
      peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      qpdf = peVar3->qpdf;
      peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      p_Var4 = (__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               QPDF::Resolver::resolved(qpdf,peVar3->og);
      peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      this_local._4_4_ = QPDFObject::getTypeCode(peVar3);
    }
    else {
      qVar2 = raw_type_code(this);
      if (qVar2 == ot_reference) {
        peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        p_Var4 = (__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::
                 get<QPDF_Reference,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                           (&peVar3->value);
        peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var4);
        this_local._4_4_ = QPDFObject::getTypeCode(peVar3);
      }
      else {
        this_local._4_4_ = raw_type_code(this);
      }
    }
  }
  else {
    this_local._4_4_ = ot_uninitialized;
  }
  return this_local._4_4_;
}

Assistant:

inline qpdf_object_type_e
    BaseHandle::type_code() const
    {
        if (!obj) {
            return ::ot_uninitialized;
        }
        if (raw_type_code() == ::ot_unresolved) {
            return QPDF::Resolver::resolved(obj->qpdf, obj->og)->getTypeCode();
        }
        if (raw_type_code() == ::ot_reference) {
            return std::get<QPDF_Reference>(obj->value).obj->getTypeCode();
        }
        return raw_type_code();
    }